

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_conforming(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_GEOM pRVar1;
  REF_CELL ref_cell;
  REF_STATUS ref_private_macro_code_rss;
  uint uVar2;
  REF_STATUS RVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  REF_DBL RVar10;
  REF_BOOL supported;
  REF_GRID local_188;
  REF_GEOM local_180;
  REF_INT node3;
  REF_INT node2;
  REF_INT cell_to_swap [2];
  REF_BOOL cell1_support;
  REF_BOOL cell0_support;
  REF_INT ncell;
  REF_DBL normdev3;
  double local_150;
  double local_148;
  REF_DBL normdev2;
  double dStack_130;
  double local_128;
  REF_DBL normdev1;
  double local_110;
  double local_108;
  REF_DBL normdev0;
  double local_f0;
  double local_e8;
  REF_CELL local_d8;
  REF_DBL area3;
  REF_DBL area2;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  local_d8 = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  *allowed = 0;
  uVar2 = ref_swap_node23(ref_grid,node0,node1,&node2,&node3);
  ref_cell = local_d8;
  if (uVar2 == 0) {
    local_188 = ref_grid;
    local_180 = pRVar1;
    uVar2 = ref_cell_list_with2(local_d8,node0,node1,2,&ncell,cell_to_swap);
    if (uVar2 == 0) {
      if ((long)ncell != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x20b,"ref_swap_conforming","there should be two triangles for manifold",2,
               (long)ncell);
        return 1;
      }
      uVar2 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
      pRVar1 = local_180;
      if (uVar2 == 0) {
        uVar2 = ref_geom_tri_supported(local_180,nodes,&cell0_support);
        if (uVar2 == 0) {
          uVar2 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
          if (uVar2 == 0) {
            uVar2 = ref_geom_tri_supported(pRVar1,nodes,&cell1_support);
            if (uVar2 == 0) {
              uVar2 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
              if ((cell0_support == 0) || (cell1_support == 0)) {
                if (uVar2 == 0) {
                  uVar2 = ref_node_tri_normal(ref_node,nodes,&normdev0);
                  if (uVar2 == 0) {
                    uVar2 = ref_math_normalize(&normdev0);
                    if (uVar2 == 0) {
                      uVar2 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
                      if (uVar2 == 0) {
                        uVar2 = ref_node_tri_normal(ref_node,nodes,&normdev1);
                        if (uVar2 == 0) {
                          uVar2 = ref_math_normalize(&normdev1);
                          if (uVar2 == 0) {
                            if (local_e8 * local_108 + normdev0 * normdev1 + local_f0 * local_110 <
                                ref_node->same_normal_tol) {
LAB_001eef1d:
                              *allowed = 0;
                              return 0;
                            }
                            nodes[1] = node3;
                            nodes[2] = node2;
                            nodes[0] = node0;
                            uVar2 = ref_node_tri_normal(ref_node,nodes,&normdev2);
                            if (uVar2 == 0) {
                              nodes[1] = node2;
                              nodes[2] = node3;
                              nodes[0] = node1;
                              uVar2 = ref_node_tri_normal(ref_node,nodes,&normdev3);
                              if (uVar2 == 0) {
                                dVar8 = local_128 * local_128 +
                                        normdev2 * normdev2 + dStack_130 * dStack_130;
                                dVar9 = local_148 * local_148 +
                                        normdev3 * normdev3 + local_150 * local_150;
                                if (dVar9 <= dVar8) {
                                  dVar8 = dVar9;
                                }
                                dVar8 = dVar8 * 1e+20;
                                if (dVar8 <= -dVar8) {
                                  dVar8 = -dVar8;
                                }
                                if (dVar8 <= 1.0) goto LAB_001eef1d;
                                uVar2 = ref_math_normalize(&normdev2);
                                if (uVar2 == 0) {
                                  uVar2 = ref_math_normalize(&normdev3);
                                  if (uVar2 == 0) {
                                    if (local_128 * local_148 +
                                        normdev2 * normdev3 + dStack_130 * local_150 <
                                        ref_node->same_normal_tol) goto LAB_001eef1d;
                                    goto LAB_001ef223;
                                  }
                                  uVar5 = (ulong)uVar2;
                                  pcVar6 = "triangle 3 has zero area";
                                  uVar4 = 0x22b;
                                }
                                else {
                                  uVar5 = (ulong)uVar2;
                                  pcVar6 = "triangle 2 has zero area";
                                  uVar4 = 0x22a;
                                }
                              }
                              else {
                                uVar5 = (ulong)uVar2;
                                pcVar6 = "tri 3 normal";
                                uVar4 = 0x224;
                              }
                            }
                            else {
                              uVar5 = (ulong)uVar2;
                              pcVar6 = "tri 2 normal";
                              uVar4 = 0x220;
                            }
                          }
                          else {
                            uVar5 = (ulong)uVar2;
                            pcVar6 = "triangle 1 has zero area";
                            uVar4 = 0x217;
                          }
                        }
                        else {
                          uVar5 = (ulong)uVar2;
                          pcVar6 = "tri 1 normal";
                          uVar4 = 0x216;
                        }
                      }
                      else {
                        uVar5 = (ulong)uVar2;
                        pcVar6 = "nodes";
                        uVar4 = 0x215;
                      }
                      uVar2 = (uint)uVar5;
                      goto LAB_001eea0b;
                    }
                    pcVar6 = "triangle 0 has zero area";
                    uVar4 = 0x214;
                  }
                  else {
                    pcVar6 = "tri 0 normal";
                    uVar4 = 0x213;
                  }
                }
                else {
                  pcVar6 = "nodes";
                  uVar4 = 0x212;
                }
              }
              else if (uVar2 == 0) {
                uVar2 = ref_geom_tri_norm_deviation(local_188,nodes,&normdev0);
                if (uVar2 == 0) {
                  uVar2 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
                  if (uVar2 == 0) {
                    uVar2 = ref_geom_tri_norm_deviation(local_188,nodes,&normdev1);
                    if (uVar2 == 0) {
                      nodes[1] = node3;
                      nodes[2] = node2;
                      nodes[0] = node0;
                      uVar2 = ref_geom_cell_tuv_supported(local_180,nodes,2,&supported);
                      if (uVar2 == 0) {
                        if (supported == 0) {
                          return 0;
                        }
                        RVar3 = ref_geom_tri_norm_deviation(local_188,nodes,&normdev2);
                        if (RVar3 != 0) {
                          return 0;
                        }
                        uVar2 = ref_geom_uv_area(local_180,nodes,&uv_area2);
                        if (uVar2 != 0) {
                          pcVar6 = "uv area";
                          uVar4 = 0x241;
LAB_001eefc9:
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                 ,uVar4,"ref_swap_conforming",(ulong)uVar2,pcVar6);
                          return uVar2;
                        }
                        uVar2 = ref_node_tri_area(ref_node,nodes,&area2);
                        if (uVar2 != 0) {
                          pcVar6 = "area2";
                          uVar4 = 0x242;
                          goto LAB_001eefc9;
                        }
                        nodes[1] = node2;
                        nodes[2] = node3;
                        nodes[0] = node1;
                        uVar2 = ref_geom_cell_tuv_supported(local_180,nodes,2,&supported);
                        if (uVar2 != 0) {
                          pcVar6 = "allow a swap to";
                          uVar4 = 0x247;
                          goto LAB_001ef07b;
                        }
                        if (supported == 0) {
                          return 0;
                        }
                        RVar3 = ref_geom_tri_norm_deviation(local_188,nodes,&normdev3);
                        if (RVar3 != 0) {
                          return 0;
                        }
                        uVar2 = ref_geom_uv_area(local_180,nodes,&uv_area3);
                        if (uVar2 != 0) {
                          pcVar6 = "uv area";
                          uVar4 = 0x24b;
                          goto LAB_001ef07b;
                        }
                        uVar2 = ref_node_tri_area(ref_node,nodes,&area3);
                        if (uVar2 != 0) {
                          pcVar6 = "area2";
                          uVar4 = 0x24c;
                          goto LAB_001ef07b;
                        }
                        RVar10 = normdev2;
                        if (normdev3 <= normdev2) {
                          RVar10 = normdev3;
                        }
                        if (normdev1 <= normdev0) {
                          normdev0 = normdev1;
                        }
                        if (RVar10 <= normdev0) {
                          if (RVar10 <= normdev0 * 0.9) goto LAB_001ef2fe;
                          dVar8 = local_188->adapt->post_min_normdev;
                          bVar7 = false;
                          if ((dVar8 < normdev2) && (bVar7 = false, dVar8 < normdev3))
                          goto LAB_001ef2a2;
                        }
                        else {
LAB_001ef2a2:
                          if (area2 <= ref_node->min_volume) {
LAB_001ef2fe:
                            bVar7 = false;
                          }
                          else {
                            bVar7 = ref_node->min_volume < area3;
                          }
                        }
                        if (local_180->meshlink != (void *)0x0) {
                          *allowed = (uint)bVar7;
                          return 0;
                        }
                        uVar2 = ref_geom_uv_area_sign
                                          (local_188,nodes[ref_cell->node_per],&sign_uv_area);
                        if (uVar2 == 0) {
                          if ((bVar7 & ref_node->min_uv_area < uv_area2 * sign_uv_area) != 1) {
                            return 0;
                          }
                          if (sign_uv_area * uv_area3 <= ref_node->min_uv_area) {
                            return 0;
                          }
LAB_001ef223:
                          *allowed = 1;
                          return 0;
                        }
                        pcVar6 = "uv area sign";
                        uVar4 = 0x260;
LAB_001ef07b:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,uVar4,"ref_swap_conforming",(ulong)uVar2,pcVar6);
                        return uVar2;
                      }
                      pcVar6 = "allow a swap to";
                      uVar4 = 0x23d;
                    }
                    else {
                      pcVar6 = "nd1";
                      uVar4 = 0x238;
                    }
                    uVar5 = (ulong)uVar2;
                    goto LAB_001eea0b;
                  }
                  pcVar6 = "nodes tri1";
                  uVar4 = 0x237;
                }
                else {
                  pcVar6 = "nd0";
                  uVar4 = 0x236;
                }
              }
              else {
                pcVar6 = "nodes tri0";
                uVar4 = 0x235;
              }
            }
            else {
              pcVar6 = "tri support";
              uVar4 = 0x20f;
            }
          }
          else {
            pcVar6 = "nodes";
            uVar4 = 0x20e;
          }
        }
        else {
          pcVar6 = "tri support";
          uVar4 = 0x20d;
        }
      }
      else {
        pcVar6 = "nodes";
        uVar4 = 0x20c;
      }
    }
    else {
      pcVar6 = "more then two";
      uVar4 = 0x20a;
    }
  }
  else {
    pcVar6 = "other nodes";
    uVar4 = 0x207;
  }
  uVar5 = (ulong)uVar2;
LAB_001eea0b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar4,
         "ref_swap_conforming",uVar5,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_swap_conforming(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_BOOL cell0_support, cell1_support;
  REF_DBL normdev0, normdev1, normdev2, normdev3;
  REF_DBL sign_uv_area, uv_area2, uv_area3, area2, area3;
  REF_BOOL normdev_allowed, uv_area_allowed;
  REF_BOOL supported;
  REF_DBL normal0[3], normal1[3], normal2[3], normal3[3], dot;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell0_support), "tri support");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell1_support), "tri support");

  if (!cell0_support || !cell1_support) {
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal0), "tri 0 normal");
    RSS(ref_math_normalize(normal0), "triangle 0 has zero area");
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal1), "tri 1 normal");
    RSS(ref_math_normalize(normal1), "triangle 1 has zero area");
    dot = ref_math_dot(normal0, normal1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    nodes[0] = node0;
    nodes[1] = node3;
    nodes[2] = node2;
    RSS(ref_node_tri_normal(ref_node, nodes, normal2), "tri 2 normal");
    nodes[0] = node1;
    nodes[1] = node2;
    nodes[2] = node3;
    RSS(ref_node_tri_normal(ref_node, nodes, normal3), "tri 3 normal");
    dot = MIN(ref_math_dot(normal2, normal2), ref_math_dot(normal3, normal3));
    if (!ref_math_divisible(1.0, dot)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_math_normalize(normal2), "triangle 2 has zero area");
    RSS(ref_math_normalize(normal3), "triangle 3 has zero area");
    dot = ref_math_dot(normal2, normal3);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev2))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area2), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area2");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev3))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area3), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area3), "area2");

  normdev_allowed =
      ((MIN(normdev2, normdev3) > MIN(normdev0, normdev1)) ||
       ((MIN(normdev2, normdev3) > 0.9 * MIN(normdev0, normdev1)) &&
        (normdev2 > ref_grid_adapt(ref_grid, post_min_normdev) &&
         normdev3 > ref_grid_adapt(ref_grid, post_min_normdev))));

  normdev_allowed = normdev_allowed &&
                    (area2 > ref_node_min_volume(ref_node)) &&
                    (area3 > ref_node_min_volume(ref_node));

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_geom)) {
    *allowed = normdev_allowed;
    return REF_SUCCESS;
  }

  RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                            &sign_uv_area),
      "uv area sign");

  uv_area_allowed = (sign_uv_area * uv_area2 > ref_node_min_uv_area(ref_node) &&
                     sign_uv_area * uv_area3 > ref_node_min_uv_area(ref_node));

  if (normdev_allowed && uv_area_allowed) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}